

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::builtin_to_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,BuiltIn builtin,StorageClass storage)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  SPIREntryPoint *pSVar4;
  runtime_error *prVar5;
  byte bVar6;
  undefined4 in_register_0000000c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  char *pcVar7;
  char *pcVar8;
  string local_48;
  BuiltIn local_24;
  
  local_24 = builtin;
  if ((int)builtin < 0x1490) {
    ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &switchD_001f9c15::switchdataD_0033c24c;
    switch(builtin) {
    case BuiltInPosition:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_Position";
      pcVar7 = "";
      break;
    case BuiltInPointSize:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_PointSize";
      pcVar7 = "";
      break;
    case 2:
    case BuiltInPatchVertices:
    case BuiltInSampleMask|BuiltInPointSize:
    case BuiltInWorkDim:
    case BuiltInGlobalSize:
    case BuiltInEnqueuedWorkgroupSize:
    case BuiltInGlobalOffset:
    case BuiltInGlobalLinearId:
    case BuiltInGlobalLinearId|BuiltInPointSize:
    case BuiltInSubgroupMaxSize:
    case BuiltInNumEnqueuedSubgroups:
      goto switchD_001f9bc7_caseD_14d0;
    case BuiltInClipDistance:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_ClipDistance";
      pcVar7 = "";
      break;
    case BuiltInCullDistance:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_CullDistance";
      pcVar7 = "";
      break;
    case BuiltInVertexId:
      if ((this->options).vulkan_semantics == true) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,
                   "Cannot implement gl_VertexID in Vulkan GLSL. This shader was created with GL semantics."
                   ,"");
        ::std::runtime_error::runtime_error(prVar5,(string *)&local_48);
        *(undefined ***)prVar5 = &PTR__runtime_error_003d4e98;
        __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      goto LAB_001fa51f;
    case BuiltInInstanceId:
      if (((this->options).vulkan_semantics == true) &&
         (pSVar4 = Compiler::get_entry_point(&this->super_Compiler),
         2 < pSVar4->model - ExecutionModelIntersectionKHR)) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,
                   "Cannot implement gl_InstanceID in Vulkan GLSL. This shader was created with GL semantics."
                   ,"");
        ::std::runtime_error::runtime_error(prVar5,(string *)&local_48);
        *(undefined ***)prVar5 = &PTR__runtime_error_003d4e98;
        __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (((this->options).es == false) && ((this->options).version < 0x8c)) {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_ARB_draw_instanced","");
        require_extension_internal(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
      }
      goto LAB_001fab80;
    case BuiltInPrimitiveId:
      if ((storage == StorageClassInput) &&
         (pSVar4 = Compiler::get_entry_point(&this->super_Compiler),
         pSVar4->model == ExecutionModelGeometry)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "gl_PrimitiveIDIn";
        pcVar7 = "";
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "gl_PrimitiveID";
        pcVar7 = "";
      }
      break;
    case BuiltInInvocationId:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_InvocationID";
      pcVar7 = "";
      break;
    case BuiltInLayer:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_Layer";
      pcVar7 = "";
      break;
    case BuiltInViewportIndex:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_ViewportIndex";
      pcVar7 = "";
      break;
    case BuiltInTessLevelOuter:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_TessLevelOuter";
      pcVar7 = "";
      break;
    case BuiltInTessLevelInner:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_TessLevelInner";
      pcVar7 = "";
      break;
    case BuiltInTessCoord:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_TessCoord";
      pcVar7 = "";
      break;
    case BuiltInFragCoord:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_FragCoord";
      pcVar7 = "";
      break;
    case BuiltInPointCoord:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_PointCoord";
      pcVar7 = "";
      break;
    case BuiltInFrontFacing:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_FrontFacing";
      pcVar7 = "";
      break;
    case BuiltInSampleId:
      bVar6 = (this->options).es;
      uVar2 = (this->options).version;
      if ((uVar2 < 0x140 & bVar6) == 1) {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_OES_sample_variables","");
        require_extension_internal(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        bVar6 = (this->options).es;
        uVar2 = (this->options).version;
      }
      if (((bVar6 & 1) == 0) && (uVar2 < 400)) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"gl_SampleID not supported before GLSL 400.","");
        ::std::runtime_error::runtime_error(prVar5,(string *)&local_48);
        *(undefined ***)prVar5 = &PTR__runtime_error_003d4e98;
        __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_SampleID";
      pcVar7 = "";
      break;
    case BuiltInSamplePosition:
      bVar6 = (this->options).es;
      uVar2 = (this->options).version;
      if ((uVar2 < 0x140 & bVar6) == 1) {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_OES_sample_variables","");
        require_extension_internal(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        bVar6 = (this->options).es;
        uVar2 = (this->options).version;
      }
      if (((bVar6 & 1) == 0) && (uVar2 < 400)) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"gl_SamplePosition not supported before GLSL 400.","");
        ::std::runtime_error::runtime_error(prVar5,(string *)&local_48);
        *(undefined ***)prVar5 = &PTR__runtime_error_003d4e98;
        __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_SamplePosition";
      pcVar7 = "";
      break;
    case BuiltInSampleMask:
      bVar6 = (this->options).es;
      uVar2 = (this->options).version;
      if ((uVar2 < 0x140 & bVar6) == 1) {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_OES_sample_variables","");
        require_extension_internal(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        bVar6 = (this->options).es;
        uVar2 = (this->options).version;
      }
      if (((bVar6 & 1) == 0) && (uVar2 < 400)) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,
                   "gl_SampleMask/gl_SampleMaskIn not supported before GLSL 400.","");
        ::std::runtime_error::runtime_error(prVar5,(string *)&local_48);
        *(undefined ***)prVar5 = &PTR__runtime_error_003d4e98;
        __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (storage == StorageClassInput) {
        pcVar8 = "gl_SampleMaskIn";
        pcVar7 = "";
      }
      else {
        pcVar8 = "gl_SampleMask";
        pcVar7 = "";
      }
      break;
    case BuiltInFragDepth:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_FragDepth";
      pcVar7 = "";
      break;
    case BuiltInHelperInvocation:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_HelperInvocation";
      pcVar7 = "";
      break;
    case BuiltInNumWorkgroups:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_NumWorkGroups";
      pcVar7 = "";
      break;
    case BuiltInWorkgroupSize:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_WorkGroupSize";
      pcVar7 = "";
      break;
    case BuiltInWorkgroupId:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_WorkGroupID";
      pcVar7 = "";
      break;
    case BuiltInLocalInvocationId:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_LocalInvocationID";
      pcVar7 = "";
      break;
    case BuiltInGlobalInvocationId:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_GlobalInvocationID";
      pcVar7 = "";
      break;
    case BuiltInLocalInvocationIndex:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_LocalInvocationIndex";
      pcVar7 = "";
      break;
    case BuiltInSubgroupSize:
      request_subgroup_feature(this,SubgroupSize);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_SubgroupSize";
      pcVar7 = "";
      break;
    case BuiltInNumSubgroups:
      request_subgroup_feature(this,NumSubgroups);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_NumSubgroups";
      pcVar7 = "";
      break;
    case BuiltInSubgroupId:
      request_subgroup_feature(this,SubgroupID);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_SubgroupID";
      pcVar7 = "";
      break;
    case BuiltInSubgroupLocalInvocationId:
      request_subgroup_feature(this,SubgroupInvocationID);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_SubgroupInvocationID";
      pcVar7 = "";
      break;
    case BuiltInVertexIndex:
      bVar1 = (this->options).vulkan_semantics;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (bVar1 == true) {
        pcVar8 = "gl_VertexIndex";
        pcVar7 = "";
        break;
      }
LAB_001fa51f:
      pcVar8 = "gl_VertexID";
      pcVar7 = "";
      break;
    case BuiltInInstanceIndex:
      if ((this->options).vulkan_semantics == true) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "gl_InstanceIndex";
        pcVar7 = "";
        break;
      }
      if (((this->options).es == false) && ((this->options).version < 0x8c)) {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_ARB_draw_instanced","");
        require_extension_internal(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
      }
      if ((this->options).vertex.support_nonzero_base_instance == true) {
        if ((this->options).vulkan_semantics == false) {
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"GL_ARB_shader_draw_parameters","");
          require_extension_internal(this,&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p);
          }
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "(gl_InstanceID + SPIRV_Cross_BaseInstance)";
        pcVar7 = "";
        break;
      }
LAB_001fab80:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_InstanceID";
      pcVar7 = "";
      break;
    default:
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &switchD_001f9d00::switchdataD_0033c2fc;
      switch(builtin) {
      case BuiltInSubgroupEqMask:
        request_subgroup_feature(this,SubgroupMask);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "gl_SubgroupEqMask";
        pcVar7 = "";
        break;
      case BuiltInSubgroupGeMask:
        request_subgroup_feature(this,SubgroupMask);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "gl_SubgroupGeMask";
        pcVar7 = "";
        break;
      case BuiltInSubgroupGtMask:
        request_subgroup_feature(this,SubgroupMask);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "gl_SubgroupGtMask";
        pcVar7 = "";
        break;
      case BuiltInSubgroupLeMask:
        request_subgroup_feature(this,SubgroupMask);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "gl_SubgroupLeMask";
        pcVar7 = "";
        break;
      case BuiltInSubgroupLtMask:
        request_subgroup_feature(this,SubgroupMask);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "gl_SubgroupLtMask";
        pcVar7 = "";
        break;
      case BuiltInSubgroupLtMask|BuiltInPointSize:
      case 0x1146:
      case BuiltInSubgroupLtMask|BuiltInClipDistance:
      case BuiltInDrawIndex|BuiltInPointSize:
      case BuiltInBaseVertex|BuiltInCullDistance:
      case BuiltInBaseVertex|BuiltInVertexId:
      case BuiltInBaseVertex|BuiltInInstanceId:
      case BuiltInBaseVertex|BuiltInPrimitiveId:
      case BuiltInPrimitiveShadingRateKHR|BuiltInPointSize:
      case 0x1152:
      case BuiltInPrimitiveShadingRateKHR|BuiltInClipDistance:
      case BuiltInPrimitiveShadingRateKHR|BuiltInCullDistance:
      case BuiltInPrimitiveShadingRateKHR|BuiltInVertexId:
      case BuiltInDeviceIndex|BuiltInPointSize:
      case BuiltInViewIndex|BuiltInPointSize:
      case 0x115a:
      case BuiltInViewIndex|BuiltInClipDistance:
        goto switchD_001f9bc7_caseD_14d0;
      case BuiltInBaseVertex:
        if ((this->options).es == true) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"BaseVertex not supported in ES profile.","");
          ::std::runtime_error::runtime_error(prVar5,(string *)&local_48);
          *(undefined ***)prVar5 = &PTR__runtime_error_003d4e98;
          __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((this->options).vulkan_semantics == true) {
          if ((this->options).version < 0x1cc) {
            local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_48,"GL_ARB_shader_draw_parameters","");
            require_extension_internal(this,&local_48);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_48._M_dataplus._M_p != &local_48.field_2) {
              operator_delete(local_48._M_dataplus._M_p);
            }
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar8 = "gl_BaseVertexARB";
            pcVar7 = "";
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar8 = "gl_BaseVertex";
            pcVar7 = "";
          }
        }
        else {
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"GL_ARB_shader_draw_parameters","");
          require_extension_internal(this,&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p);
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar8 = "SPIRV_Cross_BaseVertex";
          pcVar7 = "";
        }
        break;
      case BuiltInBaseInstance:
        if ((this->options).es == true) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"BaseInstance not supported in ES profile.","");
          ::std::runtime_error::runtime_error(prVar5,(string *)&local_48);
          *(undefined ***)prVar5 = &PTR__runtime_error_003d4e98;
          __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((this->options).vulkan_semantics == true) {
          if ((this->options).version < 0x1cc) {
            local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_48,"GL_ARB_shader_draw_parameters","");
            require_extension_internal(this,&local_48);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_48._M_dataplus._M_p != &local_48.field_2) {
              operator_delete(local_48._M_dataplus._M_p);
            }
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar8 = "gl_BaseInstanceARB";
            pcVar7 = "";
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar8 = "gl_BaseInstance";
            pcVar7 = "";
          }
        }
        else {
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"GL_ARB_shader_draw_parameters","");
          require_extension_internal(this,&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p);
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar8 = "SPIRV_Cross_BaseInstance";
          pcVar7 = "";
        }
        break;
      case BuiltInDrawIndex:
        if ((this->options).es == true) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"DrawIndex not supported in ES profile.","");
          ::std::runtime_error::runtime_error(prVar5,(string *)&local_48);
          *(undefined ***)prVar5 = &PTR__runtime_error_003d4e98;
          __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((this->options).vulkan_semantics == true) {
          if (0x1cb < (this->options).version) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar8 = "gl_DrawID";
            pcVar7 = "";
            break;
          }
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"GL_ARB_shader_draw_parameters","");
          require_extension_internal(this,&local_48);
        }
        else {
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"GL_ARB_shader_draw_parameters","");
          require_extension_internal(this,&local_48);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "gl_DrawIDARB";
        pcVar7 = "";
        break;
      case BuiltInPrimitiveShadingRateKHR:
        if ((this->options).vulkan_semantics == false) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"Can only use PrimitiveShadingRateKHR in Vulkan GLSL.","");
          ::std::runtime_error::runtime_error(prVar5,(string *)&local_48);
          *(undefined ***)prVar5 = &PTR__runtime_error_003d4e98;
          __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_EXT_fragment_shading_rate","");
        require_extension_internal(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "gl_PrimitiveShadingRateEXT";
        pcVar7 = "";
        break;
      case BuiltInDeviceIndex:
        if ((this->options).vulkan_semantics == false) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"Need Vulkan semantics for device group support.","");
          ::std::runtime_error::runtime_error(prVar5,(string *)&local_48);
          *(undefined ***)prVar5 = &PTR__runtime_error_003d4e98;
          __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_EXT_device_group","");
        require_extension_internal(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "gl_DeviceIndex";
        pcVar7 = "";
        break;
      case BuiltInViewIndex:
        bVar1 = (this->options).vulkan_semantics;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if (bVar1 == true) {
          pcVar8 = "gl_ViewIndex";
          pcVar7 = "";
        }
        else {
          pcVar8 = "gl_ViewID_OVR";
          pcVar7 = "";
        }
        break;
      case BuiltInShadingRateKHR:
        if ((this->options).vulkan_semantics == false) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"Can only use ShadingRateKHR in Vulkan GLSL.","");
          ::std::runtime_error::runtime_error(prVar5,(string *)&local_48);
          *(undefined ***)prVar5 = &PTR__runtime_error_003d4e98;
          __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_EXT_fragment_shading_rate","");
        require_extension_internal(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "gl_ShadingRateEXT";
        pcVar7 = "";
        break;
      default:
        ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_register_0000000c,storage);
        if (builtin != BuiltInFragStencilRefEXT) goto switchD_001f9bc7_caseD_14d0;
        if ((this->options).es != false) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"Stencil export not supported in GLES.","");
          ::std::runtime_error::runtime_error(prVar5,(string *)&local_48);
          *(undefined ***)prVar5 = &PTR__runtime_error_003d4e98;
          __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_ARB_shader_stencil_export","");
        require_extension_internal(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "gl_FragStencilRefARB";
        pcVar7 = "";
      }
    }
    goto LAB_001facf6;
  }
  ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &switchD_001f9bc7::switchdataD_0033c3a8;
  switch(builtin) {
  case BuiltInLaunchIdKHR:
    bVar1 = this->ray_tracing_is_khr;
    pcVar8 = "gl_LaunchIDNV";
    if ((ulong)bVar1 != 0) {
      pcVar8 = "gl_LaunchIDEXT";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = pcVar8 + (ulong)bVar1 + 0xd;
    break;
  case BuiltInLaunchSizeKHR:
    bVar1 = this->ray_tracing_is_khr;
    pcVar8 = "gl_LaunchSizeNV";
    if ((ulong)bVar1 != 0) {
      pcVar8 = "gl_LaunchSizeEXT";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = pcVar8 + (ulong)bVar1 + 0xf;
    break;
  case BuiltInWorldRayOriginKHR:
    bVar1 = this->ray_tracing_is_khr;
    pcVar8 = "gl_WorldRayOriginNV";
    if ((ulong)bVar1 != 0) {
      pcVar8 = "gl_WorldRayOriginEXT";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = pcVar8 + (ulong)bVar1 + 0x13;
    break;
  case BuiltInWorldRayDirectionKHR:
    bVar1 = this->ray_tracing_is_khr;
    pcVar8 = "gl_WorldRayDirectionNV";
    if ((ulong)bVar1 != 0) {
      pcVar8 = "gl_WorldRayDirectionEXT";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = pcVar8 + (ulong)bVar1 + 0x16;
    break;
  case BuiltInObjectRayOriginKHR:
    bVar1 = this->ray_tracing_is_khr;
    pcVar8 = "gl_ObjectRayOriginNV";
    if ((ulong)bVar1 != 0) {
      pcVar8 = "gl_ObjectRayOriginEXT";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = pcVar8 + (ulong)bVar1 + 0x14;
    break;
  case BuiltInObjectRayDirectionKHR:
    bVar1 = this->ray_tracing_is_khr;
    pcVar8 = "gl_ObjectRayDirectionNV";
    if ((ulong)bVar1 != 0) {
      pcVar8 = "gl_ObjectRayDirectionEXT";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = pcVar8 + (ulong)bVar1 + 0x17;
    break;
  case BuiltInRayTminKHR:
    uVar3 = (ulong)this->ray_tracing_is_khr;
    pcVar7 = "gl_RayTminEXT";
    pcVar8 = "gl_RayTminNV";
    goto LAB_001f9f47;
  case BuiltInRayTmaxKHR:
    uVar3 = (ulong)this->ray_tracing_is_khr;
    pcVar7 = "gl_RayTmaxEXT";
    pcVar8 = "gl_RayTmaxNV";
    goto LAB_001f9f47;
  case BuiltInInstanceCustomIndexKHR:
    bVar1 = this->ray_tracing_is_khr;
    pcVar8 = "gl_InstanceCustomIndexNV";
    if ((ulong)bVar1 != 0) {
      pcVar8 = "gl_InstanceCustomIndexEXT";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = pcVar8 + (ulong)bVar1 + 0x18;
    break;
  case 0x14d0:
  case 0x14d1:
  case BuiltInCurrentRayTimeNV:
  case BuiltInCurrentRayTimeNV|BuiltInPointSize:
  case 0x14d8:
  case 0x14d9:
  case 0x14da:
  case 0x14db:
  case 0x14dc:
  case 0x14dd:
  case 0x14de:
  case 0x14df:
  case 0x14e0:
  case 0x14e1:
  case 0x14e2:
  case 0x14e3:
  case 0x14e4:
  case 0x14e5:
  case 0x14e6:
switchD_001f9bc7_caseD_14d0:
    convert_to_string<spv::BuiltIn,_0>(&local_48,&local_24);
    join<char_const(&)[12],std::__cxx11::string>
              (__return_storage_ptr__,(spirv_cross *)"gl_BuiltIn_",(char (*) [12])&local_48,ts_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_48._M_dataplus._M_p);
    return __return_storage_ptr__;
  case BuiltInObjectToWorldKHR:
    bVar6 = this->ray_tracing_is_khr;
    pcVar7 = "gl_ObjectToWorldEXT";
    pcVar8 = "gl_ObjectToWorldNV";
    goto LAB_001f9e22;
  case BuiltInWorldToObjectKHR:
    bVar6 = this->ray_tracing_is_khr;
    pcVar7 = "gl_WorldToObjectEXT";
    pcVar8 = "gl_WorldToObjectNV";
LAB_001f9e22:
    if ((ulong)bVar6 != 0) {
      pcVar8 = pcVar7;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = pcVar8 + (ulong)bVar6 + 0x12;
    break;
  case BuiltInHitTNV:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_HitTNV";
    pcVar7 = "";
    break;
  case BuiltInHitKindKHR:
    uVar3 = (ulong)this->ray_tracing_is_khr;
    pcVar7 = "gl_HitKindEXT";
    pcVar8 = "gl_HitKindNV";
LAB_001f9f47:
    if (uVar3 != 0) {
      pcVar8 = pcVar7;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = pcVar8 + uVar3 + 0xc;
    break;
  case BuiltInIncomingRayFlagsKHR:
    bVar1 = this->ray_tracing_is_khr;
    pcVar8 = "gl_IncomingRayFlagsNV";
    if ((ulong)bVar1 != 0) {
      pcVar8 = "gl_IncomingRayFlagsEXT";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = pcVar8 + (ulong)bVar1 + 0x15;
    break;
  default:
    ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &switchD_001f9c4e::switchdataD_0033c370;
    switch(builtin) {
    case BuiltInBaryCoordKHR:
      bVar1 = (this->options).es;
      uVar2 = (this->options).version;
      if ((uVar2 < 0x140 & bVar1) == 1) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"gl_BaryCoordEXT requires ESSL 320.","");
        ::std::runtime_error::runtime_error(prVar5,(string *)&local_48);
        *(undefined ***)prVar5 = &PTR__runtime_error_003d4e98;
        __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (bVar1 == false && uVar2 < 0x1c2) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"gl_BaryCoordEXT requires GLSL 450.","");
        ::std::runtime_error::runtime_error(prVar5,(string *)&local_48);
        *(undefined ***)prVar5 = &PTR__runtime_error_003d4e98;
        __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (this->barycentric_is_nv == true) {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_NV_fragment_shader_barycentric","");
        require_extension_internal(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "gl_BaryCoordNV";
        pcVar7 = "";
      }
      else {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_EXT_fragment_shader_barycentric","");
        require_extension_internal(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "gl_BaryCoordEXT";
        pcVar7 = "";
      }
      break;
    case BuiltInBaryCoordNoPerspKHR:
      bVar1 = (this->options).es;
      uVar2 = (this->options).version;
      if ((uVar2 < 0x140 & bVar1) == 1) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"gl_BaryCoordNoPerspEXT requires ESSL 320.","");
        ::std::runtime_error::runtime_error(prVar5,(string *)&local_48);
        *(undefined ***)prVar5 = &PTR__runtime_error_003d4e98;
        __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (bVar1 == false && uVar2 < 0x1c2) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"gl_BaryCoordNoPerspEXT requires GLSL 450.","");
        ::std::runtime_error::runtime_error(prVar5,(string *)&local_48);
        *(undefined ***)prVar5 = &PTR__runtime_error_003d4e98;
        __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (this->barycentric_is_nv == true) {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_NV_fragment_shader_barycentric","");
        require_extension_internal(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "gl_BaryCoordNoPerspNV";
        pcVar7 = "";
      }
      else {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_EXT_fragment_shader_barycentric","");
        require_extension_internal(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "gl_BaryCoordNoPerspEXT";
        pcVar7 = "";
      }
      break;
    case BuiltInMeshViewCountNV|BuiltInInvocationId:
    case BuiltInMeshViewCountNV|BuiltInLayer:
    case BuiltInMeshViewCountNV|BuiltInViewportIndex:
    case BuiltInMeshViewCountNV|BuiltInTessLevelOuter:
    case BuiltInFragSizeEXT:
    case BuiltInFragInvocationCountEXT:
    case BuiltInPrimitiveTriangleIndicesEXT|BuiltInPointSize:
    case 0x14b2:
      goto switchD_001f9bc7_caseD_14d0;
    case BuiltInPrimitivePointIndicesEXT:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_PrimitivePointIndicesEXT";
      pcVar7 = "";
      break;
    case BuiltInPrimitiveLineIndicesEXT:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_PrimitiveLineIndicesEXT";
      pcVar7 = "";
      break;
    case BuiltInPrimitiveTriangleIndicesEXT:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_PrimitiveTriangleIndicesEXT";
      pcVar7 = "";
      break;
    case BuiltInCullPrimitiveEXT:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_CullPrimitiveEXT";
      pcVar7 = "";
      break;
    default:
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_register_0000000c,storage);
      if (builtin != BuiltInFullyCoveredEXT) goto switchD_001f9bc7_caseD_14d0;
      if ((this->options).es != false) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,
                   "Need desktop GL to use GL_NV_conservative_raster_underestimation.","");
        ::std::runtime_error::runtime_error(prVar5,(string *)&local_48);
        *(undefined ***)prVar5 = &PTR__runtime_error_003d4e98;
        __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"GL_NV_conservative_raster_underestimation","");
      require_extension_internal(this,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_FragFullyCoveredNV";
      pcVar7 = "";
    }
  }
LAB_001facf6:
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar8,pcVar7);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::builtin_to_glsl(BuiltIn builtin, StorageClass storage)
{
	switch (builtin)
	{
	case BuiltInPosition:
		return "gl_Position";
	case BuiltInPointSize:
		return "gl_PointSize";
	case BuiltInClipDistance:
		return "gl_ClipDistance";
	case BuiltInCullDistance:
		return "gl_CullDistance";
	case BuiltInVertexId:
		if (options.vulkan_semantics)
			SPIRV_CROSS_THROW("Cannot implement gl_VertexID in Vulkan GLSL. This shader was created "
			                  "with GL semantics.");
		return "gl_VertexID";
	case BuiltInInstanceId:
		if (options.vulkan_semantics)
		{
			auto model = get_entry_point().model;
			switch (model)
			{
			case spv::ExecutionModelIntersectionKHR:
			case spv::ExecutionModelAnyHitKHR:
			case spv::ExecutionModelClosestHitKHR:
				// gl_InstanceID is allowed in these shaders.
				break;

			default:
				SPIRV_CROSS_THROW("Cannot implement gl_InstanceID in Vulkan GLSL. This shader was "
				                  "created with GL semantics.");
			}
		}
		if (!options.es && options.version < 140)
		{
			require_extension_internal("GL_ARB_draw_instanced");
		}
		return "gl_InstanceID";
	case BuiltInVertexIndex:
		if (options.vulkan_semantics)
			return "gl_VertexIndex";
		else
			return "gl_VertexID"; // gl_VertexID already has the base offset applied.
	case BuiltInInstanceIndex:
		if (options.vulkan_semantics)
			return "gl_InstanceIndex";

		if (!options.es && options.version < 140)
		{
			require_extension_internal("GL_ARB_draw_instanced");
		}

		if (options.vertex.support_nonzero_base_instance)
		{
			if (!options.vulkan_semantics)
			{
				// This is a soft-enable. We will opt-in to using gl_BaseInstanceARB if supported.
				require_extension_internal("GL_ARB_shader_draw_parameters");
			}
			return "(gl_InstanceID + SPIRV_Cross_BaseInstance)"; // ... but not gl_InstanceID.
		}
		else
			return "gl_InstanceID";
	case BuiltInPrimitiveId:
		if (storage == StorageClassInput && get_entry_point().model == ExecutionModelGeometry)
			return "gl_PrimitiveIDIn";
		else
			return "gl_PrimitiveID";
	case BuiltInInvocationId:
		return "gl_InvocationID";
	case BuiltInLayer:
		return "gl_Layer";
	case BuiltInViewportIndex:
		return "gl_ViewportIndex";
	case BuiltInTessLevelOuter:
		return "gl_TessLevelOuter";
	case BuiltInTessLevelInner:
		return "gl_TessLevelInner";
	case BuiltInTessCoord:
		return "gl_TessCoord";
	case BuiltInFragCoord:
		return "gl_FragCoord";
	case BuiltInPointCoord:
		return "gl_PointCoord";
	case BuiltInFrontFacing:
		return "gl_FrontFacing";
	case BuiltInFragDepth:
		return "gl_FragDepth";
	case BuiltInNumWorkgroups:
		return "gl_NumWorkGroups";
	case BuiltInWorkgroupSize:
		return "gl_WorkGroupSize";
	case BuiltInWorkgroupId:
		return "gl_WorkGroupID";
	case BuiltInLocalInvocationId:
		return "gl_LocalInvocationID";
	case BuiltInGlobalInvocationId:
		return "gl_GlobalInvocationID";
	case BuiltInLocalInvocationIndex:
		return "gl_LocalInvocationIndex";
	case BuiltInHelperInvocation:
		return "gl_HelperInvocation";

	case BuiltInBaseVertex:
		if (options.es)
			SPIRV_CROSS_THROW("BaseVertex not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_BaseVertexARB";
			}
			return "gl_BaseVertex";
		}
		// On regular GL, this is soft-enabled and we emit ifdefs in code.
		require_extension_internal("GL_ARB_shader_draw_parameters");
		return "SPIRV_Cross_BaseVertex";

	case BuiltInBaseInstance:
		if (options.es)
			SPIRV_CROSS_THROW("BaseInstance not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_BaseInstanceARB";
			}
			return "gl_BaseInstance";
		}
		// On regular GL, this is soft-enabled and we emit ifdefs in code.
		require_extension_internal("GL_ARB_shader_draw_parameters");
		return "SPIRV_Cross_BaseInstance";

	case BuiltInDrawIndex:
		if (options.es)
			SPIRV_CROSS_THROW("DrawIndex not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_DrawIDARB";
			}
			return "gl_DrawID";
		}
		// On regular GL, this is soft-enabled and we emit ifdefs in code.
		require_extension_internal("GL_ARB_shader_draw_parameters");
		return "gl_DrawIDARB";

	case BuiltInSampleId:
		if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		if (!options.es && options.version < 400)
			SPIRV_CROSS_THROW("gl_SampleID not supported before GLSL 400.");
		return "gl_SampleID";

	case BuiltInSampleMask:
		if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		if (!options.es && options.version < 400)
			SPIRV_CROSS_THROW("gl_SampleMask/gl_SampleMaskIn not supported before GLSL 400.");

		if (storage == StorageClassInput)
			return "gl_SampleMaskIn";
		else
			return "gl_SampleMask";

	case BuiltInSamplePosition:
		if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		if (!options.es && options.version < 400)
			SPIRV_CROSS_THROW("gl_SamplePosition not supported before GLSL 400.");
		return "gl_SamplePosition";

	case BuiltInViewIndex:
		if (options.vulkan_semantics)
			return "gl_ViewIndex";
		else
			return "gl_ViewID_OVR";

	case BuiltInNumSubgroups:
		request_subgroup_feature(ShaderSubgroupSupportHelper::NumSubgroups);
		return "gl_NumSubgroups";

	case BuiltInSubgroupId:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupID);
		return "gl_SubgroupID";

	case BuiltInSubgroupSize:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupSize);
		return "gl_SubgroupSize";

	case BuiltInSubgroupLocalInvocationId:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupInvocationID);
		return "gl_SubgroupInvocationID";

	case BuiltInSubgroupEqMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupEqMask";

	case BuiltInSubgroupGeMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupGeMask";

	case BuiltInSubgroupGtMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupGtMask";

	case BuiltInSubgroupLeMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupLeMask";

	case BuiltInSubgroupLtMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupLtMask";

	case BuiltInLaunchIdKHR:
		return ray_tracing_is_khr ? "gl_LaunchIDEXT" : "gl_LaunchIDNV";
	case BuiltInLaunchSizeKHR:
		return ray_tracing_is_khr ? "gl_LaunchSizeEXT" : "gl_LaunchSizeNV";
	case BuiltInWorldRayOriginKHR:
		return ray_tracing_is_khr ? "gl_WorldRayOriginEXT" : "gl_WorldRayOriginNV";
	case BuiltInWorldRayDirectionKHR:
		return ray_tracing_is_khr ? "gl_WorldRayDirectionEXT" : "gl_WorldRayDirectionNV";
	case BuiltInObjectRayOriginKHR:
		return ray_tracing_is_khr ? "gl_ObjectRayOriginEXT" : "gl_ObjectRayOriginNV";
	case BuiltInObjectRayDirectionKHR:
		return ray_tracing_is_khr ? "gl_ObjectRayDirectionEXT" : "gl_ObjectRayDirectionNV";
	case BuiltInRayTminKHR:
		return ray_tracing_is_khr ? "gl_RayTminEXT" : "gl_RayTminNV";
	case BuiltInRayTmaxKHR:
		return ray_tracing_is_khr ? "gl_RayTmaxEXT" : "gl_RayTmaxNV";
	case BuiltInInstanceCustomIndexKHR:
		return ray_tracing_is_khr ? "gl_InstanceCustomIndexEXT" : "gl_InstanceCustomIndexNV";
	case BuiltInObjectToWorldKHR:
		return ray_tracing_is_khr ? "gl_ObjectToWorldEXT" : "gl_ObjectToWorldNV";
	case BuiltInWorldToObjectKHR:
		return ray_tracing_is_khr ? "gl_WorldToObjectEXT" : "gl_WorldToObjectNV";
	case BuiltInHitTNV:
		// gl_HitTEXT is an alias of RayTMax in KHR.
		return "gl_HitTNV";
	case BuiltInHitKindKHR:
		return ray_tracing_is_khr ? "gl_HitKindEXT" : "gl_HitKindNV";
	case BuiltInIncomingRayFlagsKHR:
		return ray_tracing_is_khr ? "gl_IncomingRayFlagsEXT" : "gl_IncomingRayFlagsNV";

	case BuiltInBaryCoordKHR:
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("gl_BaryCoordEXT requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("gl_BaryCoordEXT requires GLSL 450.");

		if (barycentric_is_nv)
		{
			require_extension_internal("GL_NV_fragment_shader_barycentric");
			return "gl_BaryCoordNV";
		}
		else
		{
			require_extension_internal("GL_EXT_fragment_shader_barycentric");
			return "gl_BaryCoordEXT";
		}
	}

	case BuiltInBaryCoordNoPerspNV:
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("gl_BaryCoordNoPerspEXT requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("gl_BaryCoordNoPerspEXT requires GLSL 450.");

		if (barycentric_is_nv)
		{
			require_extension_internal("GL_NV_fragment_shader_barycentric");
			return "gl_BaryCoordNoPerspNV";
		}
		else
		{
			require_extension_internal("GL_EXT_fragment_shader_barycentric");
			return "gl_BaryCoordNoPerspEXT";
		}
	}

	case BuiltInFragStencilRefEXT:
	{
		if (!options.es)
		{
			require_extension_internal("GL_ARB_shader_stencil_export");
			return "gl_FragStencilRefARB";
		}
		else
			SPIRV_CROSS_THROW("Stencil export not supported in GLES.");
	}

	case BuiltInPrimitiveShadingRateKHR:
	{
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Can only use PrimitiveShadingRateKHR in Vulkan GLSL.");
		require_extension_internal("GL_EXT_fragment_shading_rate");
		return "gl_PrimitiveShadingRateEXT";
	}

	case BuiltInShadingRateKHR:
	{
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Can only use ShadingRateKHR in Vulkan GLSL.");
		require_extension_internal("GL_EXT_fragment_shading_rate");
		return "gl_ShadingRateEXT";
	}

	case BuiltInDeviceIndex:
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Need Vulkan semantics for device group support.");
		require_extension_internal("GL_EXT_device_group");
		return "gl_DeviceIndex";

	case BuiltInFullyCoveredEXT:
		if (!options.es)
			require_extension_internal("GL_NV_conservative_raster_underestimation");
		else
			SPIRV_CROSS_THROW("Need desktop GL to use GL_NV_conservative_raster_underestimation.");
		return "gl_FragFullyCoveredNV";

	case BuiltInPrimitiveTriangleIndicesEXT:
		return "gl_PrimitiveTriangleIndicesEXT";
	case BuiltInPrimitiveLineIndicesEXT:
		return "gl_PrimitiveLineIndicesEXT";
	case BuiltInPrimitivePointIndicesEXT:
		return "gl_PrimitivePointIndicesEXT";
	case BuiltInCullPrimitiveEXT:
		return "gl_CullPrimitiveEXT";

	default:
		return join("gl_BuiltIn_", convert_to_string(builtin));
	}
}